

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::Detail::StringMakerBase<true>::convert<bsim::dynamic_bit_vector>
                   (string *__return_storage_ptr__,dynamic_bit_vector *_value)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ostringstream oss;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  if (0 < _value->N) {
    iVar4 = _value->N + 1;
    do {
      uVar1 = iVar4 - 2;
      uVar2 = iVar4 + 5;
      if (-1 < (int)uVar1) {
        uVar2 = uVar1;
      }
      pcVar3 = "0";
      if (((_value->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[(int)uVar2 >> 3] >> (uVar1 & 7) & 1) != 0) {
        pcVar3 = "1";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,pcVar3,1);
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }